

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnintf.c
# Opt level: O0

UINT8 device_ym2610_link_ssg(void *param,UINT8 devID,DEV_INFO *defInfSSG)

{
  UINT8 local_49;
  undefined1 local_48 [7];
  UINT8 retVal;
  ssg_callbacks ssgfunc;
  DEV_INFO *defInfSSG_local;
  UINT8 devID_local;
  void *param_local;
  
  if (devID == '\0') {
    ssgfunc.reset = (DEVFUNC_CTRL)defInfSSG;
    if (defInfSSG == (DEV_INFO *)0x0) {
      ym2610_link_ssg(param,(ssg_callbacks *)0x0,(void *)0x0);
      local_49 = '\0';
    }
    else {
      local_49 = get_ssg_funcs(defInfSSG->devDef,(ssg_callbacks *)local_48);
      if (local_49 == '\0') {
        ym2610_link_ssg(param,(ssg_callbacks *)local_48,*(void **)ssgfunc.reset);
      }
    }
    param_local._7_1_ = local_49;
  }
  else {
    param_local._7_1_ = 0xf0;
  }
  return param_local._7_1_;
}

Assistant:

static UINT8 device_ym2610_link_ssg(void* param, UINT8 devID, const DEV_INFO* defInfSSG)
{
	ssg_callbacks ssgfunc;
	UINT8 retVal;
	
	if (devID != LINKDEV_SSG)
		return EERR_UNK_DEVICE;
	
	if (defInfSSG == NULL)
	{
		ym2610_link_ssg(param, NULL, NULL);
		retVal = 0x00;
	}
	else
	{
		retVal = get_ssg_funcs(defInfSSG->devDef, &ssgfunc);
		if (! retVal)
			ym2610_link_ssg(param, &ssgfunc, defInfSSG->dataPtr);
	}
	return retVal;
}